

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void cfd::core::MergeWallyMap
               (wally_map *src,wally_map *dst,string *item_name,bool ignore_duplicate_error)

{
  uint8_t *src_00;
  size_t src_len;
  uint8_t *dest;
  size_t dest_len;
  bool bVar1;
  int iVar2;
  wally_map_item *pwVar3;
  reference puVar4;
  CfdException *pCVar5;
  allocator local_169;
  string local_168;
  CfdSourceLocation local_148;
  undefined1 local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  CfdSourceLocation local_e8;
  wally_map_item *local_d0;
  wally_map_item *dst_item_1;
  unsigned_long dst_idx_1;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  undefined1 local_78 [8];
  ByteData key;
  wally_map_item *src_item;
  size_t src_idx;
  wally_map_item *dst_item;
  size_t dst_idx;
  vector<unsigned_long,_std::allocator<unsigned_long>_> regist_indexes;
  int ret;
  bool is_find;
  bool ignore_duplicate_error_local;
  string *item_name_local;
  wally_map *dst_local;
  wally_map *src_local;
  
  regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = ignore_duplicate_error;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx);
  dst_item = (wally_map_item *)0x0;
  do {
    if ((wally_map_item *)dst->num_items <= dst_item) {
      bVar1 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx);
      if (!bVar1) {
        __end3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx);
        dst_idx_1 = (unsigned_long)
                    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      *)&dst_idx_1);
          if (!bVar1) break;
          puVar4 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&__end3);
          dst_item_1 = (wally_map_item *)*puVar4;
          local_d0 = dst->items + (long)dst_item_1;
          regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               wally_map_add(src,local_d0->key,local_d0->key_len,local_d0->value,local_d0->value_len
                            );
          if ((int)regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
            local_e8.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_e8.filename = local_e8.filename + 1;
            local_e8.line = 0x179;
            local_e8.funcname = "MergeWallyMap";
            logger::warn<int&>(&local_e8,"wally_map_add NG[{}]",
                               (int *)&regist_indexes.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_129 = 1;
            pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::operator+(&local_128,"psbt add ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             item_name);
            ::std::operator+(&local_108,&local_128," error.");
            CfdException::CfdException(pCVar5,kCfdMemoryFullError,&local_108);
            local_129 = 0;
            __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
          }
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end3);
        }
        regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = wally_map_sort(src,0);
        if ((int)regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
          local_148.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                       ,0x2f);
          local_148.filename = local_148.filename + 1;
          local_148.line = 0x181;
          local_148.funcname = "MergeWallyMap";
          logger::warn<int&>(&local_148,"wally_map_sort NG[{}]",
                             (int *)&regist_indexes.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_168,"psbt sort map error.",&local_169);
          CfdException::CfdException(pCVar5,kCfdInternalError,&local_168);
          __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
        }
        regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      }
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx);
      return;
    }
    pwVar3 = dst->items + (long)dst_item;
    regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    for (src_item = (wally_map_item *)0x0; src_item < (wally_map_item *)src->num_items;
        src_item = (wally_map_item *)((long)&src_item->key + 1)) {
      key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(src->items + (long)src_item);
      if (((wally_map_item *)
          key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->key_len == pwVar3->key_len) {
        iVar2 = memcmp(((wally_map_item *)
                       key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)->key,pwVar3->key,
                       ((wally_map_item *)
                       key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)->key_len);
        if (iVar2 == 0) {
          regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          ByteData::ByteData((ByteData *)local_78,
                             *(uint8_t **)
                              key.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             *(uint32_t *)
                              (key.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 8));
          src_00 = *(uint8_t **)
                    (key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10);
          src_len = *(size_t *)
                     (key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x18);
          dest = pwVar3->value;
          dest_len = pwVar3->value_len;
          ByteData::GetHex_abi_cxx11_((string *)&__range3,(ByteData *)local_78);
          ComparePsbtData(src_00,src_len,dest,dest_len,item_name,(string *)&__range3,
                          (bool)(regist_indexes.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
          ::std::__cxx11::string::~string((string *)&__range3);
          ByteData::~ByteData((ByteData *)local_78);
          break;
        }
      }
    }
    if ((regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx,
                 (value_type_conflict2 *)&dst_item);
    }
    dst_item = (wally_map_item *)((long)&dst_item->key + 1);
  } while( true );
}

Assistant:

void MergeWallyMap(
    struct wally_map *src, const struct wally_map *dst,
    const std::string &item_name, bool ignore_duplicate_error) {
  bool is_find;
  int ret;
  std::vector<size_t> regist_indexes;
  for (size_t dst_idx = 0; dst_idx < dst->num_items; ++dst_idx) {
    auto dst_item = &dst->items[dst_idx];
    is_find = false;
    for (size_t src_idx = 0; src_idx < src->num_items; ++src_idx) {
      auto src_item = &src->items[src_idx];
      if ((src_item->key_len == dst_item->key_len) &&
          (memcmp(src_item->key, dst_item->key, src_item->key_len) == 0)) {
        is_find = true;
        ByteData key(src_item->key, static_cast<uint32_t>(src_item->key_len));
        ComparePsbtData(
            src_item->value, src_item->value_len, dst_item->value,
            dst_item->value_len, item_name, key.GetHex(),
            ignore_duplicate_error);
        break;
      }
    }
    if (!is_find) regist_indexes.push_back(dst_idx);
  }
  if (!regist_indexes.empty()) {
    for (auto dst_idx : regist_indexes) {
      auto dst_item = &dst->items[dst_idx];
      ret = wally_map_add(
          src, dst_item->key, dst_item->key_len, dst_item->value,
          dst_item->value_len);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
        throw CfdException(
            kCfdMemoryFullError, "psbt add " + item_name + " error.");
      }
    }

    ret = wally_map_sort(src, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt sort map error.");
    }
  }
}